

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLoadExpr
          (BinaryReaderInterp *this,Opcode opcode,Index memidx,Address align_log2,Address offset)

{
  Istream *this_00;
  Index index;
  bool bVar1;
  uint32_t uVar2;
  Enum op;
  Location local_c8;
  Var local_a8;
  Opcode local_5c;
  Location local_58;
  Enum local_34;
  Address local_30;
  Address offset_local;
  Address align_log2_local;
  BinaryReaderInterp *pBStack_18;
  Index memidx_local;
  BinaryReaderInterp *this_local;
  Opcode opcode_local;
  
  local_30 = offset;
  offset_local = align_log2;
  align_log2_local._4_4_ = memidx;
  pBStack_18 = this;
  this_local._0_4_ = opcode.enum_;
  GetLocation(&local_58,this);
  index = align_log2_local._4_4_;
  local_5c.enum_ = this_local._0_4_;
  GetLocation(&local_c8,this);
  Var::Var(&local_a8,index,&local_c8);
  uVar2 = GetAlignment(offset_local);
  local_34 = (Enum)SharedValidator::OnLoad
                             (&this->validator_,&local_58,local_5c,&local_a8,(ulong)uVar2,local_30);
  bVar1 = Failed((Result)local_34);
  Var::~Var(&local_a8);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = this->istream_;
    op = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
    Istream::Emit(this_00,op,align_log2_local._4_4_,(u32)local_30);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnLoadExpr(Opcode opcode,
                                      Index memidx,
                                      Address align_log2,
                                      Address offset) {
  CHECK_RESULT(validator_.OnLoad(GetLocation(), opcode,
                                 Var(memidx, GetLocation()),
                                 GetAlignment(align_log2), offset));
  istream_.Emit(opcode, memidx, offset);
  return Result::Ok;
}